

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_rkv.c
# Opt level: O1

MPP_RET hal_vp9d_rkv_start(void *hal,HalTaskInfo *task)

{
  long *plVar1;
  MppDev ctx;
  long lVar2;
  MPP_RET MVar3;
  long *plVar4;
  char *fmt;
  ulong uVar5;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  long local_50 [3];
  undefined8 local_38;
  
  plVar1 = (long *)(*(long *)((long)hal + 0x40) + 0xe0);
  plVar4 = plVar1;
  if (*(int *)((long)hal + 0x38) != 0) {
    plVar4 = (long *)((long)(task->dec).reg_index * 0x40 + *(long *)((long)hal + 0x40) + 0x30);
  }
  ctx = *(MppDev *)((long)hal + 0x10);
  lVar2 = *plVar4;
  if ((lVar2 == 0) &&
     (_mpp_log_l(2,"hal_vp9d_rkv","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
                 "hal_vp9d_rkv_start",0x21a), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  if (((byte)hal_vp9d_debug & 4) != 0) {
    uVar5 = 0;
    do {
      _mpp_log_l(4,"hal_vp9d_rkv","set regs[%02d]: %08X\n",(char *)0x0,uVar5 & 0xffffffff,
                 (ulong)*(uint *)(lVar2 + uVar5 * 4));
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 != 0x4e);
  }
  local_50[2] = *plVar1;
  local_38 = 0x138;
  MVar3 = mpp_dev_ioctl(ctx,4,local_50 + 2);
  if (MVar3 == MPP_OK) {
    local_50[0] = *plVar1;
    local_50[1] = 0x138;
    MVar3 = mpp_dev_ioctl(ctx,5,local_50);
    if (MVar3 == MPP_OK) {
      MVar3 = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
      if (MVar3 == MPP_OK) {
        return MPP_OK;
      }
      _mpp_log_l(2,"hal_vp9d_rkv","send cmd failed %d\n","hal_vp9d_rkv_start",(ulong)(uint)MVar3);
      return MVar3;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_vp9d_rkv",fmt,"hal_vp9d_rkv_start",(ulong)(uint)MVar3);
  return MVar3;
}

Assistant:

MPP_RET hal_vp9d_rkv_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;
    Vp9dRkvCtx *hw_ctx = (Vp9dRkvCtx*)p_hal->hw_ctx;
    VP9_REGS *hw_regs = (VP9_REGS *)hw_ctx->hw_regs;
    MppDev dev = p_hal->dev;

    if (p_hal->fast_mode) {
        RK_S32 index =  task->dec.reg_index;
        hw_regs = (VP9_REGS *)hw_ctx->g_buf[index].hw_regs;
    }

    mpp_assert(hw_regs);

    if (hal_vp9d_debug & HAL_VP9D_DBG_REG) {
        RK_U32 *p = (RK_U32 *)hw_regs;
        RK_U32 i = 0;

        for (i = 0; i < sizeof(VP9_REGS) / 4; i++)
            mpp_log("set regs[%02d]: %08X\n", i, *p++);
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = sizeof(VP9_REGS);

        wr_cfg.reg = hw_ctx->hw_regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = hw_ctx->hw_regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}